

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O3

void __thiscall
QRasterPaintEngine::drawTiledPixmap(QRasterPaintEngine *this,QRectF *r,QPixmap *pixmap,QPointF *sr)

{
  QTransform *this_00;
  QRasterPaintEnginePrivate *this_01;
  QPaintEngineState *pQVar1;
  bool bVar2;
  QSpanData *this_02;
  int iVar3;
  TransformationType TVar4;
  QPlatformPixmap *pQVar5;
  QClipData *pQVar6;
  long lVar7;
  QPaintEngineState *pQVar8;
  QRasterBuffer *this_03;
  QTransform *pQVar9;
  QTransform *pQVar10;
  QPaintEngineState *pQVar11;
  long in_FS_OFFSET;
  byte bVar12;
  ulong uVar13;
  qreal qVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  QColor QVar18;
  QPainterPath path;
  QPointF local_f8;
  QPointF local_e8;
  undefined1 local_d8 [8];
  double dStack_d0;
  QImageData *local_c8;
  double dStack_c0;
  undefined1 local_b8 [16];
  QImageData *local_a8;
  undefined1 local_98 [12];
  Representation RStack_8c;
  QTransform local_88;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar8 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
  this_01 = (QRasterPaintEnginePrivate *)(this->super_QPaintEngineEx).super_QPaintEngine.d_ptr.d;
  pQVar11 = pQVar8 + -2;
  if (pQVar8 == (QPaintEngineState *)0x0) {
    pQVar11 = (QPaintEngineState *)0x0;
  }
  local_a8 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
  local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QImage::QImage((QImage *)local_b8);
  pQVar5 = QPixmap::handle(pixmap);
  if (pQVar5->id == 0) {
    this_03 = (QRasterBuffer *)(pQVar5 + 1);
    QImage::operator=((QImage *)local_b8,(QImage *)this_03);
  }
  else {
    this_03 = (QRasterBuffer *)pixmap;
    QPixmap::toImage((QImage *)local_d8,pixmap);
    local_88.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_88.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_88.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_88);
    local_88.m_matrix[0][2] = (qreal)local_a8;
    local_a8 = local_c8;
    local_88.m_matrix[0][0] = (qreal)&PTR__QImage_007d1ec8;
    local_c8 = (QImageData *)0x0;
    QImage::~QImage((QImage *)&local_88);
    QImage::~QImage((QImage *)local_d8);
  }
  iVar3 = QImage::depth((QImage *)local_b8);
  if (iVar3 == 1) {
    QVar18 = QPen::color((QPen *)(pQVar11 + 0x10));
    _local_98 = QVar18._0_14_;
    QRasterBuffer::colorizeBitmap((QImage *)local_d8,this_03,(QImage *)local_b8,(QColor *)local_98);
    local_88.m_matrix[0][2] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_88.m_matrix[0][0] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_88.m_matrix[0][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPaintDevice::QPaintDevice((QPaintDevice *)&local_88);
    local_88.m_matrix[0][2] = (qreal)local_a8;
    local_a8 = local_c8;
    local_88.m_matrix[0][0] = (qreal)&PTR__QImage_007d1ec8;
    local_c8 = (QImageData *)0x0;
    QImage::~QImage((QImage *)&local_88);
    QImage::~QImage((QImage *)local_d8);
  }
  qVar14 = QPixmap::devicePixelRatio(pixmap);
  this_00 = (QTransform *)(pQVar11 + 0x36);
  TVar4 = QTransform::type(this_00);
  if ((1.0 < qVar14) || (1 < (int)TVar4)) {
    pQVar9 = this_00;
    pQVar10 = &local_88;
    for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
      pQVar10->m_matrix[0][0] = pQVar9->m_matrix[0][0];
      pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
      pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar12 * -2 + 1) * 8);
    }
    QTransform::translate(&local_88,r->xp,r->yp);
    QTransform::translate(&local_88,-sr->xp,-sr->yp);
    QTransform::scale(&local_88,1.0 / qVar14,1.0 / qVar14);
    pQVar8 = ((this_01->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
    if (((pQVar8 == (QPaintEngineState *)0x0) ||
        (pQVar6 = *(QClipData **)(pQVar8 + 0x100), pQVar6 == (QClipData *)0x0)) ||
       ((pQVar6->field_0x48 & 1) == 0)) {
      pQVar6 = (this_01->baseClip).d;
    }
    this_02 = &this_01->image_filler_xform;
    (this_01->image_filler_xform).clip = pQVar6;
    local_d8 = (undefined1  [8])0x0;
    dStack_d0 = -NAN;
    QSpanData::initTexture
              (this_02,(QImage *)local_b8,
               pQVar11[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
               super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,Tiled,(QRect *)local_d8);
    if ((this_01->image_filler_xform).blend != (ProcessSpans)0x0) {
      QSpanData::setupMatrix
                (this_02,&local_88,
                 pQVar11[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                 super_QFlagsStorage<QPaintEngine::DirtyFlag>.i >> 4 & 1);
      pQVar1 = (this->super_QPaintEngineEx).super_QPaintEngine.state;
      pQVar8 = pQVar1 + -2;
      if (pQVar1 == (QPaintEngineState *)0x0) {
        pQVar8 = (QPaintEngineState *)0x0;
      }
      if (pQVar8[0x104].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
          super_QFlagsStorage<QPaintEngine::DirtyFlag>.i != 0) {
        updateRasterState(this);
      }
      if ((pQVar11[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
        TVar4 = QTransform::type(this_00);
        if (TVar4 != TxScale) {
          local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          QPainterPath::QPainterPath((QPainterPath *)local_d8);
          QPainterPath::addRect((QPainterPath *)local_d8,r);
          (*(this->super_QPaintEngineEx).super_QPaintEngine._vptr_QPaintEngine[0x36])
                    (this,(QPainterPath *)local_d8,this_02);
          QPainterPath::~QPainterPath((QPainterPath *)local_d8);
          goto LAB_003c0ddf;
        }
      }
      QRasterPaintEnginePrivate::initializeRasterizer(this_01,this_02);
      QRasterizer::setAntialiased
                ((this_01->rasterizer).d,
                 SUB41(((ushort)pQVar11[0x105].dirtyFlags.
                                super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
                                super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 8) >> 3,0));
      QRectF::normalized();
      local_98._8_4_ = 0xffffffff;
      local_98._0_4_ = -1;
      local_98._4_4_ = -1;
      RStack_8c.m_i = -1;
      local_e8.yp = (dStack_d0 + dStack_c0 + dStack_d0) * 0.5;
      local_e8.xp = ((double)local_d8 + (double)local_d8) * 0.5;
      _local_98 = (QRect)QTransform::map(this_00,&local_e8);
      local_e8.yp._0_4_ = 0xffffffff;
      local_e8.xp = -NAN;
      local_e8.yp._4_4_ = 0xffffffff;
      local_f8.xp = ((double)local_d8 + (double)local_c8 + (double)local_d8 + (double)local_c8) *
                    0.5;
      local_f8.yp = (dStack_d0 + dStack_d0 + dStack_c0) * 0.5;
      local_e8 = QTransform::map(this_00,&local_f8);
      if ((pQVar11[0x105].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
           super_QFlagsStorage<QPaintEngine::DirtyFlag>.i & 0x40) == 0) {
        dVar16 = (*(double *)(pQVar11 + 0x3e) * dStack_c0) /
                 (*(double *)(pQVar11 + 0x36) * (double)local_c8);
        uVar13 = -(ulong)(dVar16 < -dVar16);
        qVar14 = (qreal)(~uVar13 & (ulong)dVar16 | (ulong)-dVar16 & uVar13);
      }
      else {
        qVar14 = dStack_c0 / (double)local_c8;
      }
      QRasterizer::rasterizeLine((this_01->rasterizer).d,(QPointF *)local_98,&local_e8,qVar14,false)
      ;
    }
  }
  else {
    pQVar8 = ((this_01->super_QPaintEngineExPrivate).super_QPaintEnginePrivate.q_ptr)->state;
    if (((pQVar8 == (QPaintEngineState *)0x0) ||
        (pQVar6 = *(QClipData **)(pQVar8 + 0x100), pQVar6 == (QClipData *)0x0)) ||
       ((pQVar6->field_0x48 & 1) == 0)) {
      pQVar6 = (this_01->baseClip).d;
    }
    (this_01->image_filler).clip = pQVar6;
    local_88.m_matrix[0][0] = 0.0;
    local_88.m_matrix[0][1] = -NAN;
    QSpanData::initTexture
              (&this_01->image_filler,(QImage *)local_b8,
               pQVar11[0xfe].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
               super_QFlagsStorage<QPaintEngine::DirtyFlag>.i,Tiled,(QRect *)&local_88);
    if ((this_01->image_filler).blend != (ProcessSpans)0x0) {
      (this_01->image_filler).dx = sr->xp - (r->xp + *(double *)(pQVar11 + 0x42));
      (this_01->image_filler).dy = sr->yp - (r->yp + *(double *)(pQVar11 + 0x44));
      local_88.m_matrix[0][2] = r->w;
      local_88.m_matrix[1][0] = r->h;
      local_88.m_matrix[0][0] = *(double *)(pQVar11 + 0x42) + r->xp;
      local_88.m_matrix[0][1] = *(double *)(pQVar11 + 0x44) + r->yp;
      QRectF::normalized();
      dVar15 = (double)((ulong)local_d8 & 0x8000000000000000 | 0x3fe0000000000000) +
               (double)local_d8;
      dVar16 = dVar15;
      if (dVar15 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      dVar15 = (double)(-(ulong)(2147483647.0 < dVar15) & 0x41dfffffffc00000 |
                       ~-(ulong)(2147483647.0 < dVar15) & (ulong)dVar16);
      local_98._0_4_ = (undefined4)dVar15;
      dVar17 = (double)((ulong)dStack_d0 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_d0;
      dVar16 = dVar17;
      if (dVar17 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      dVar17 = (double)(-(ulong)(2147483647.0 < dVar17) & 0x41dfffffffc00000 |
                       ~-(ulong)(2147483647.0 < dVar17) & (ulong)dVar16);
      local_98._4_4_ = (undefined4)dVar17;
      dVar16 = ((double)local_d8 - (double)(int)dVar15) * 0.5 + (double)local_c8;
      dVar16 = (double)((ulong)dVar16 & 0x8000000000000000 | 0x3fe0000000000000) + dVar16;
      bVar2 = 2147483647.0 < dVar16;
      if (dVar16 <= -2147483648.0) {
        dVar16 = -2147483648.0;
      }
      dStack_c0 = (dStack_d0 - (double)(int)dVar17) * 0.5 + dStack_c0;
      dStack_c0 = (double)((ulong)dStack_c0 & 0x8000000000000000 | 0x3fe0000000000000) + dStack_c0;
      dVar15 = dStack_c0;
      if (dStack_c0 <= -2147483648.0) {
        dVar15 = -2147483648.0;
      }
      RStack_8c.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dStack_c0) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dStack_c0) & (ulong)dVar15) + local_98._4_4_ + -1;
      local_98._8_4_ =
           (int)(double)(-(ulong)bVar2 & 0x41dfffffffc00000 | ~-(ulong)bVar2 & (ulong)dVar16) +
           local_98._0_4_ + -1;
      fillRect_normalized((QRect *)local_98,&this_01->image_filler,this_01);
    }
  }
LAB_003c0ddf:
  QImage::~QImage((QImage *)local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRasterPaintEngine::drawTiledPixmap(const QRectF &r, const QPixmap &pixmap, const QPointF &sr)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << " - QRasterPaintEngine::drawTiledPixmap(), r=" << r << "pixmap=" << pixmap.size();
#endif
    Q_D(QRasterPaintEngine);
    QRasterPaintEngineState *s = state();
    Q_ASSERT(s);

    QImage image;

    QPlatformPixmap *pd = pixmap.handle();
    if (pd->classId() == QPlatformPixmap::RasterClass) {
        image = static_cast<QRasterPlatformPixmap *>(pd)->image;
    } else {
        image = pixmap.toImage();
    }

    if (image.depth() == 1)
        image = d->rasterBuffer->colorizeBitmap(image, s->pen.color());

    const qreal pixmapDevicePixelRatio = pixmap.devicePixelRatio();
    if (s->matrix.type() > QTransform::TxTranslate || pixmapDevicePixelRatio > qreal(1.0)) {
        QTransform copy = s->matrix;
        copy.translate(r.x(), r.y());
        copy.translate(-sr.x(), -sr.y());
        const qreal inverseDpr = qreal(1.0) / pixmapDevicePixelRatio;
        copy.scale(inverseDpr, inverseDpr);
        d->image_filler_xform.clip = d->clip();
        d->image_filler_xform.initTexture(&image, s->intOpacity, QTextureData::Tiled);
        if (!d->image_filler_xform.blend)
            return;
        d->image_filler_xform.setupMatrix(copy, s->flags.bilinear);

#ifdef QT_FAST_SPANS
        ensureRasterState();
        if (s->flags.tx_noshear || s->matrix.type() == QTransform::TxScale) {
            d->initializeRasterizer(&d->image_filler_xform);
            d->rasterizer->setAntialiased(s->flags.antialiased);

            const QRectF &rect = r.normalized();
            const QPointF a = s->matrix.map((rect.topLeft() + rect.bottomLeft()) * 0.5f);
            const QPointF b = s->matrix.map((rect.topRight() + rect.bottomRight()) * 0.5f);
            if (s->flags.tx_noshear)
                d->rasterizer->rasterizeLine(a, b, rect.height() / rect.width());
            else
                d->rasterizer->rasterizeLine(a, b, qAbs((s->matrix.m22() * rect.height()) / (s->matrix.m11() * rect.width())));
            return;
        }
#endif
        QPainterPath path;
        path.addRect(r);
        fillPath(path, &d->image_filler_xform);
    } else {
        d->image_filler.clip = d->clip();

        d->image_filler.initTexture(&image, s->intOpacity, QTextureData::Tiled);
        if (!d->image_filler.blend)
            return;
        d->image_filler.dx = -(r.x() + s->matrix.dx()) + sr.x();
        d->image_filler.dy = -(r.y() + s->matrix.dy()) + sr.y();

        QRectF rr = r;
        rr.translate(s->matrix.dx(), s->matrix.dy());
        fillRect_normalized(rr.normalized().toRect(), &d->image_filler, d);
    }
}